

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *xnode;
  xml_node_struct *pxVar1;
  void *pvVar2;
  void *pvVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  xml_node_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_node_struct *pxVar8;
  xml_attribute_struct *xnode_00;
  bool bVar9;
  
  pxVar6 = *(xml_node_struct **)this;
  xnode_00 = *(xml_attribute_struct **)(this + 8);
  pvVar2 = document_buffer_order((anon_unknown_0 *)pxVar6,(xpath_node *)xnode_00);
  pxVar7 = (lhs->_node)._root;
  xnode = (lhs->_attribute)._attr;
  pvVar3 = document_buffer_order((anon_unknown_0 *)pxVar7,(xpath_node *)xnode);
  if (pvVar3 != (void *)0x0 && pvVar2 != (void *)0x0) {
    return pvVar2 < pvVar3;
  }
  if (xnode_00 == (xml_attribute_struct *)0x0) {
    if (xnode != (xml_attribute_struct *)0x0 && pxVar7 == pxVar6) {
      return true;
    }
  }
  else if ((xnode != (xml_attribute_struct *)0x0) && (pxVar6 == pxVar7)) {
    if (xnode_00 == xnode) {
      return true;
    }
    do {
      xnode_00 = xnode_00->next_attribute;
      if (xnode_00 == (xml_attribute_struct *)0x0) break;
    } while (xnode_00 != xnode);
    return xnode_00 != (xml_attribute_struct *)0x0;
  }
  if (pxVar6 == pxVar7) {
    return false;
  }
  pxVar8 = pxVar6;
  pxVar1 = pxVar7;
  if (pxVar7 == (xml_node_struct *)0x0 || pxVar6 == (xml_node_struct *)0x0) {
    return pxVar6 < pxVar7;
  }
LAB_0012d4cd:
  pxVar4 = pxVar1;
  pxVar5 = pxVar8;
  if ((pxVar5 != (xml_node_struct *)0x0) && (pxVar4 != (xml_node_struct *)0x0))
  goto code_r0x0012d4dd;
  bVar9 = pxVar5 == (xml_node_struct *)0x0;
  if (!bVar9) {
    do {
      pxVar5 = pxVar5->parent;
      pxVar6 = pxVar6->parent;
    } while (pxVar5 != (xml_node_struct *)0x0);
  }
  for (; pxVar4 != (xml_node_struct *)0x0; pxVar4 = pxVar4->parent) {
    pxVar7 = pxVar7->parent;
  }
  if (pxVar6 == pxVar7) {
    return bVar9;
  }
  do {
    pxVar4 = pxVar7;
    pxVar5 = pxVar6;
    pxVar6 = pxVar5->parent;
    pxVar7 = pxVar4->parent;
  } while (pxVar6 != pxVar4->parent);
  pxVar7 = pxVar4;
  pxVar8 = pxVar5;
  if (pxVar6 == (xml_node_struct *)0x0) goto LAB_0012d59e;
  do {
    bVar9 = pxVar8 == pxVar4;
    if (bVar9) {
      return bVar9;
    }
    if (pxVar7 == pxVar5) {
      return bVar9;
    }
    pxVar7 = pxVar7->next_sibling;
  } while ((pxVar8->next_sibling != (xml_node_struct *)0x0) &&
          (pxVar8 = pxVar8->next_sibling, pxVar7 != (xml_node_struct *)0x0));
  goto LAB_0012d58c;
code_r0x0012d4dd:
  pxVar8 = pxVar5->parent;
  pxVar1 = pxVar4->parent;
  if (pxVar8 == pxVar4->parent) {
    pxVar7 = pxVar4;
    pxVar6 = pxVar5;
    if (pxVar8 == (xml_node_struct *)0x0) {
LAB_0012d59e:
      bVar9 = pxVar5 < pxVar4;
    }
    else {
      do {
        bVar9 = pxVar6 == pxVar4;
        if (bVar9) {
          return bVar9;
        }
        if (pxVar7 == pxVar5) {
          return bVar9;
        }
        pxVar7 = pxVar7->next_sibling;
      } while ((pxVar6->next_sibling != (xml_node_struct *)0x0) &&
              (pxVar6 = pxVar6->next_sibling, pxVar7 != (xml_node_struct *)0x0));
LAB_0012d58c:
      bVar9 = pxVar7 == (xml_node_struct *)0x0;
    }
    return bVar9;
  }
  goto LAB_0012d4cd;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}